

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_optional.h
# Opt level: O0

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::aliases_t<char,4ul,unsigned_char,7ul>,date::characters_t<char,3ul>,date::unsigned_integer_t<unsigned_char,1u,2u>&,date::character_t<char>&,date::aliases_t<char,4ul,unsigned_char,12ul>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
               *fmt,unsigned_integer_t<unsigned_char,_1U,_2U> *others,character_t<char> *others_1,
               aliases_t<char,_4UL,_unsigned_char,_12UL> *others_2,character_t<char> *others_3,
               unsigned_integer_t<unsigned_short,_2U,_4U> *others_4,character_t<char> *others_5,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_6,character_t<char> *others_7,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_8,
               optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
               *others_9,character_t<char> *others_10,
               cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others_11)

{
  bool bVar1;
  undefined1 local_88 [8];
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> begin;
  aliases_t<char,_4UL,_unsigned_char,_12UL> *others_local_2;
  character_t<char> *others_local_1;
  unsigned_integer_t<unsigned_char,_1U,_2U> *others_local;
  optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>
  *fmt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_local;
  
  begin.m_position = (size_t)others_2;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::iterator_proxy
            ((iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)local_88,
             pos);
  bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,std::tuple<date::aliases_t<char,4ul,unsigned_char,7ul>,date::characters_t<char,3ul>>,0ul,1ul>
                    (pos,end,fmt);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator=
              (pos,(iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                   local_88);
  }
  bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_char,1u,2u,date::character_t<char>&,date::aliases_t<char,4ul,unsigned_char,12ul>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
                    (pos,end,others,others_1,
                     (aliases_t<char,_4UL,_unsigned_char,_12UL> *)begin.m_position,others_3,others_4
                     ,others_5,others_6,others_7,others_8,others_9,others_10,others_11);
  return bVar1;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, optional_t<Formatters...>& fmt, Others&&... others)
{
    Iterator begin = pos;
    if (!read_impl(pos, end, fmt.formatters, std_impl::make_index_sequence<sizeof...(Formatters)>{}))
    {
        //! TODO: unset values of the optional formatters.
        pos = std::move(begin);
    }
    return read_impl(pos, end, std::forward<Others>(others)...);
}